

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Ref<embree::Geometry> *pRVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 (*pauVar27) [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined8 uVar34;
  byte bVar35;
  int iVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  undefined1 (*pauVar46) [16];
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  vint4 bi;
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  vint4 bi_1;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  float fVar72;
  vint4 ai;
  undefined1 auVar73 [16];
  uint uVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13e0 [8];
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [8];
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float local_1240;
  float fStack_123c;
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  undefined4 local_1220;
  undefined4 uStack_121c;
  undefined4 uStack_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined4 local_1200;
  undefined4 uStack_11fc;
  undefined4 uStack_11f8;
  undefined4 uStack_11f4;
  undefined4 uStack_11f0;
  undefined4 uStack_11ec;
  undefined4 uStack_11e8;
  undefined4 uStack_11e4;
  undefined4 local_11e0;
  undefined4 uStack_11dc;
  undefined4 uStack_11d8;
  undefined4 uStack_11d4;
  undefined4 uStack_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c8;
  undefined4 uStack_11c4;
  undefined1 local_11c0 [32];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  undefined4 uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  ulong uVar40;
  float fVar61;
  float fVar65;
  float fVar66;
  
  pauVar46 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar50._4_4_ = fVar2;
  auVar50._0_4_ = fVar2;
  auVar50._8_4_ = fVar2;
  auVar50._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar51._4_4_ = fVar3;
  auVar51._0_4_ = fVar3;
  auVar51._8_4_ = fVar3;
  auVar51._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar52._4_4_ = fVar4;
  auVar52._0_4_ = fVar4;
  auVar52._8_4_ = fVar4;
  auVar52._12_4_ = fVar4;
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar36 = (tray->tfar).field_0.i[k];
  auVar71 = ZEXT1664(CONCAT412(iVar36,CONCAT48(iVar36,CONCAT44(iVar36,iVar36))));
  auVar53._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar53._8_4_ = -fVar2;
  auVar53._12_4_ = -fVar2;
  auVar54._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar54._8_4_ = -fVar3;
  auVar54._12_4_ = -fVar3;
  auVar55._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  auVar55._8_4_ = -fVar4;
  auVar55._12_4_ = -fVar4;
  iVar36 = (tray->tnear).field_0.i[k];
  auVar56._4_4_ = iVar36;
  auVar56._0_4_ = iVar36;
  auVar56._8_4_ = iVar36;
  auVar56._12_4_ = iVar36;
  local_1280._16_16_ = mm_lookupmask_ps._240_16_;
  local_1280._0_16_ = mm_lookupmask_ps._0_16_;
  auVar74._8_4_ = 0x3f800000;
  auVar74._0_8_ = 0x3f8000003f800000;
  auVar74._12_4_ = 0x3f800000;
  auVar74._16_4_ = 0x3f800000;
  auVar74._20_4_ = 0x3f800000;
  auVar74._24_4_ = 0x3f800000;
  auVar74._28_4_ = 0x3f800000;
  auVar87._8_4_ = 0xbf800000;
  auVar87._0_8_ = 0xbf800000bf800000;
  auVar87._12_4_ = 0xbf800000;
  auVar87._16_4_ = 0xbf800000;
  auVar87._20_4_ = 0xbf800000;
  auVar87._24_4_ = 0xbf800000;
  auVar87._28_4_ = 0xbf800000;
  local_12a0 = vblendvps_avx(auVar74,auVar87,local_1280);
LAB_0050cd64:
  do {
    pauVar27 = pauVar46 + -1;
    pauVar46 = pauVar46 + -1;
    if (*(float *)(*pauVar27 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar49 = *(ulong *)*pauVar46;
      while ((uVar49 & 8) == 0) {
        auVar57 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar49 + 0x20 + uVar42),auVar53,auVar50);
        auVar62 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar49 + 0x20 + uVar44),auVar54,auVar51);
        auVar57 = vpmaxsd_avx(auVar57,auVar62);
        auVar62 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar49 + 0x20 + uVar45),auVar55,auVar52);
        auVar62 = vpmaxsd_avx(auVar62,auVar56);
        auVar62 = vpmaxsd_avx(auVar57,auVar62);
        auVar57 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar49 + 0x20 + (uVar42 ^ 0x10)),auVar53,
                                  auVar50);
        auVar73 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar49 + 0x20 + (uVar44 ^ 0x10)),auVar54,
                                  auVar51);
        auVar57 = vpminsd_avx(auVar57,auVar73);
        auVar73 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar49 + 0x20 + (uVar45 ^ 0x10)),auVar55,
                                  auVar52);
        auVar73 = vpminsd_avx(auVar73,auVar71._0_16_);
        auVar57 = vpminsd_avx(auVar57,auVar73);
        auVar57 = vpcmpgtd_avx(auVar62,auVar57);
        iVar36 = vmovmskps_avx(auVar57);
        local_1180._0_16_ = auVar62;
        if (iVar36 == 0xf) {
          if (pauVar46 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_0050cd64;
        }
        bVar35 = (byte)iVar36 ^ 0xf;
        uVar47 = uVar49 & 0xfffffffffffffff0;
        lVar48 = 0;
        for (uVar49 = (ulong)bVar35; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
          lVar48 = lVar48 + 1;
        }
        uVar49 = *(ulong *)(uVar47 + lVar48 * 8);
        uVar37 = bVar35 - 1 & (uint)bVar35;
        uVar40 = (ulong)uVar37;
        if (uVar37 != 0) {
          uVar38 = *(uint *)(local_1180 + lVar48 * 4);
          lVar48 = 0;
          for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
            lVar48 = lVar48 + 1;
          }
          uVar37 = uVar37 - 1 & uVar37;
          uVar43 = (ulong)uVar37;
          uVar40 = *(ulong *)(uVar47 + lVar48 * 8);
          uVar39 = *(uint *)(local_1180 + lVar48 * 4);
          if (uVar37 == 0) {
            if (uVar38 < uVar39) {
              *(ulong *)*pauVar46 = uVar40;
              *(uint *)(*pauVar46 + 8) = uVar39;
              pauVar46 = pauVar46 + 1;
            }
            else {
              *(ulong *)*pauVar46 = uVar49;
              *(uint *)(*pauVar46 + 8) = uVar38;
              pauVar46 = pauVar46 + 1;
              uVar49 = uVar40;
            }
          }
          else {
            auVar57._8_8_ = 0;
            auVar57._0_8_ = uVar49;
            auVar57 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar38));
            auVar62._8_8_ = 0;
            auVar62._0_8_ = uVar40;
            auVar62 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar39));
            lVar48 = 0;
            for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
              lVar48 = lVar48 + 1;
            }
            uVar37 = uVar37 - 1 & uVar37;
            uVar49 = (ulong)uVar37;
            auVar73._8_8_ = 0;
            auVar73._0_8_ = *(ulong *)(uVar47 + lVar48 * 8);
            auVar16 = vpunpcklqdq_avx(auVar73,ZEXT416(*(uint *)(local_1180 + lVar48 * 4)));
            auVar73 = vpcmpgtd_avx(auVar62,auVar57);
            if (uVar37 == 0) {
              auVar81 = vpshufd_avx(auVar73,0xaa);
              auVar73 = vblendvps_avx(auVar62,auVar57,auVar81);
              auVar57 = vblendvps_avx(auVar57,auVar62,auVar81);
              auVar62 = vpcmpgtd_avx(auVar16,auVar73);
              auVar81 = vpshufd_avx(auVar62,0xaa);
              auVar62 = vblendvps_avx(auVar16,auVar73,auVar81);
              auVar73 = vblendvps_avx(auVar73,auVar16,auVar81);
              auVar16 = vpcmpgtd_avx(auVar73,auVar57);
              auVar81 = vpshufd_avx(auVar16,0xaa);
              auVar16 = vblendvps_avx(auVar73,auVar57,auVar81);
              auVar57 = vblendvps_avx(auVar57,auVar73,auVar81);
              *pauVar46 = auVar57;
              pauVar46[1] = auVar16;
              uVar49 = auVar62._0_8_;
              pauVar46 = pauVar46 + 2;
            }
            else {
              lVar48 = 0;
              for (; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
                lVar48 = lVar48 + 1;
              }
              auVar81._8_8_ = 0;
              auVar81._0_8_ = *(ulong *)(uVar47 + lVar48 * 8);
              auVar17 = vpunpcklqdq_avx(auVar81,ZEXT416(*(uint *)(local_1180 + lVar48 * 4)));
              auVar81 = vpshufd_avx(auVar73,0xaa);
              auVar73 = vblendvps_avx(auVar62,auVar57,auVar81);
              auVar57 = vblendvps_avx(auVar57,auVar62,auVar81);
              auVar62 = vpcmpgtd_avx(auVar17,auVar16);
              auVar81 = vpshufd_avx(auVar62,0xaa);
              auVar62 = vblendvps_avx(auVar17,auVar16,auVar81);
              auVar16 = vblendvps_avx(auVar16,auVar17,auVar81);
              auVar81 = vpcmpgtd_avx(auVar16,auVar57);
              auVar17 = vpshufd_avx(auVar81,0xaa);
              auVar81 = vblendvps_avx(auVar16,auVar57,auVar17);
              auVar57 = vblendvps_avx(auVar57,auVar16,auVar17);
              auVar16 = vpcmpgtd_avx(auVar62,auVar73);
              auVar17 = vpshufd_avx(auVar16,0xaa);
              auVar16 = vblendvps_avx(auVar62,auVar73,auVar17);
              auVar62 = vblendvps_avx(auVar73,auVar62,auVar17);
              auVar73 = vpcmpgtd_avx(auVar81,auVar62);
              auVar17 = vpshufd_avx(auVar73,0xaa);
              auVar73 = vblendvps_avx(auVar81,auVar62,auVar17);
              auVar62 = vblendvps_avx(auVar62,auVar81,auVar17);
              *pauVar46 = auVar57;
              pauVar46[1] = auVar62;
              pauVar46[2] = auVar73;
              uVar49 = auVar16._0_8_;
              pauVar46 = pauVar46 + 3;
            }
          }
        }
      }
      uVar47 = (ulong)((uint)uVar49 & 0xf);
      if (uVar47 != 8) {
        local_11e0 = *(undefined4 *)(ray + k * 4);
        uStack_11dc = local_11e0;
        uStack_11d8 = local_11e0;
        uStack_11d4 = local_11e0;
        uStack_11d0 = local_11e0;
        uStack_11cc = local_11e0;
        uStack_11c8 = local_11e0;
        uStack_11c4 = local_11e0;
        local_1200 = *(undefined4 *)(ray + k * 4 + 0x10);
        uStack_11fc = local_1200;
        uStack_11f8 = local_1200;
        uStack_11f4 = local_1200;
        uStack_11f0 = local_1200;
        uStack_11ec = local_1200;
        uStack_11e8 = local_1200;
        uStack_11e4 = local_1200;
        local_1220 = *(undefined4 *)(ray + k * 4 + 0x20);
        uStack_121c = local_1220;
        uStack_1218 = local_1220;
        uStack_1214 = local_1220;
        uStack_1210 = local_1220;
        uStack_120c = local_1220;
        uStack_1208 = local_1220;
        uStack_1204 = local_1220;
        fVar2 = *(float *)(ray + k * 4 + 0x40);
        local_1240 = *(float *)(ray + k * 4 + 0x50);
        fStack_123c = local_1240;
        fStack_1238 = local_1240;
        fStack_1234 = local_1240;
        fStack_1230 = local_1240;
        fStack_122c = local_1240;
        fStack_1228 = local_1240;
        fStack_1224 = local_1240;
        uVar49 = uVar49 & 0xfffffffffffffff0;
        local_1260 = *(float *)(ray + k * 4 + 0x60);
        fStack_125c = local_1260;
        fStack_1258 = local_1260;
        fStack_1254 = local_1260;
        fStack_1250 = local_1260;
        fStack_124c = local_1260;
        fStack_1248 = local_1260;
        fStack_1244 = local_1260;
        lVar48 = 0;
        do {
          lVar41 = lVar48 * 0xe0;
          lVar1 = uVar49 + 0xd0 + lVar41;
          local_11a0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_1198 = *(undefined8 *)(lVar1 + 0x18);
          lVar1 = uVar49 + 0xc0 + lVar41;
          local_12e0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_12d8 = *(undefined8 *)(lVar1 + 0x18);
          uStack_12d0 = local_12e0;
          uStack_12c8 = uStack_12d8;
          uStack_1190 = local_11a0;
          uStack_1188 = uStack_1198;
          auVar88._16_16_ = *(undefined1 (*) [16])(uVar49 + 0x60 + lVar41);
          auVar88._0_16_ = *(undefined1 (*) [16])(uVar49 + lVar41);
          auVar86._16_16_ = *(undefined1 (*) [16])(uVar49 + 0x70 + lVar41);
          auVar86._0_16_ = *(undefined1 (*) [16])(uVar49 + 0x10 + lVar41);
          auVar82._16_16_ = *(undefined1 (*) [16])(uVar49 + 0x80 + lVar41);
          auVar82._0_16_ = *(undefined1 (*) [16])(uVar49 + 0x20 + lVar41);
          auVar57 = *(undefined1 (*) [16])(uVar49 + 0x30 + lVar41);
          auVar58._16_16_ = auVar57;
          auVar58._0_16_ = auVar57;
          auVar57 = *(undefined1 (*) [16])(uVar49 + 0x40 + lVar41);
          auVar75._16_16_ = auVar57;
          auVar75._0_16_ = auVar57;
          auVar57 = *(undefined1 (*) [16])(uVar49 + 0x50 + lVar41);
          auVar83._16_16_ = auVar57;
          auVar83._0_16_ = auVar57;
          auVar62 = *(undefined1 (*) [16])(uVar49 + 0x90 + lVar41);
          auVar67._16_16_ = auVar62;
          auVar67._0_16_ = auVar62;
          lVar1 = uVar49 + 0xa0 + lVar41;
          pauVar27 = (undefined1 (*) [16])(lVar1 + 0x10);
          uStack_13d0 = *(undefined8 *)*pauVar27;
          _local_13e0 = *pauVar27;
          uStack_13c8 = *(undefined8 *)(lVar1 + 0x18);
          lVar41 = uVar49 + 0xb0 + lVar41;
          pauVar27 = (undefined1 (*) [16])(lVar41 + 0x10);
          uStack_13b0 = *(undefined8 *)*pauVar27;
          _local_13c0 = *pauVar27;
          uStack_13a8 = *(undefined8 *)(lVar41 + 0x18);
          auVar74 = vsubps_avx(auVar88,auVar58);
          auVar87 = vsubps_avx(auVar86,auVar75);
          auVar10 = vsubps_avx(auVar82,auVar83);
          local_11c0 = vsubps_avx(auVar67,auVar88);
          auVar11 = vsubps_avx(_local_13e0,auVar86);
          auVar12 = vsubps_avx(_local_13c0,auVar82);
          auVar13._4_4_ = auVar87._4_4_ * auVar12._4_4_;
          auVar13._0_4_ = auVar87._0_4_ * auVar12._0_4_;
          auVar13._8_4_ = auVar87._8_4_ * auVar12._8_4_;
          auVar13._12_4_ = auVar87._12_4_ * auVar12._12_4_;
          auVar13._16_4_ = auVar87._16_4_ * auVar12._16_4_;
          auVar13._20_4_ = auVar87._20_4_ * auVar12._20_4_;
          auVar13._24_4_ = auVar87._24_4_ * auVar12._24_4_;
          auVar13._28_4_ = auVar57._12_4_;
          auVar16 = vfmsub231ps_fma(auVar13,auVar11,auVar10);
          auVar14._4_4_ = auVar10._4_4_ * local_11c0._4_4_;
          auVar14._0_4_ = auVar10._0_4_ * local_11c0._0_4_;
          auVar14._8_4_ = auVar10._8_4_ * local_11c0._8_4_;
          auVar14._12_4_ = auVar10._12_4_ * local_11c0._12_4_;
          auVar14._16_4_ = auVar10._16_4_ * local_11c0._16_4_;
          auVar14._20_4_ = auVar10._20_4_ * local_11c0._20_4_;
          auVar14._24_4_ = auVar10._24_4_ * local_11c0._24_4_;
          auVar14._28_4_ = auVar11._28_4_;
          auVar81 = vfmsub231ps_fma(auVar14,auVar12,auVar74);
          auVar33._4_4_ = uStack_11dc;
          auVar33._0_4_ = local_11e0;
          auVar33._8_4_ = uStack_11d8;
          auVar33._12_4_ = uStack_11d4;
          auVar33._16_4_ = uStack_11d0;
          auVar33._20_4_ = uStack_11cc;
          auVar33._24_4_ = uStack_11c8;
          auVar33._28_4_ = uStack_11c4;
          auVar13 = vsubps_avx(auVar88,auVar33);
          auVar32._4_4_ = uStack_11fc;
          auVar32._0_4_ = local_1200;
          auVar32._8_4_ = uStack_11f8;
          auVar32._12_4_ = uStack_11f4;
          auVar32._16_4_ = uStack_11f0;
          auVar32._20_4_ = uStack_11ec;
          auVar32._24_4_ = uStack_11e8;
          auVar32._28_4_ = uStack_11e4;
          auVar14 = vsubps_avx(auVar86,auVar32);
          auVar15._4_4_ = uStack_121c;
          auVar15._0_4_ = local_1220;
          auVar15._8_4_ = uStack_1218;
          auVar15._12_4_ = uStack_1214;
          auVar15._16_4_ = uStack_1210;
          auVar15._20_4_ = uStack_120c;
          auVar15._24_4_ = uStack_1208;
          auVar15._28_4_ = uStack_1204;
          auVar15 = vsubps_avx(auVar82,auVar15);
          auVar28._4_4_ = fVar2;
          auVar28._0_4_ = fVar2;
          auVar28._8_4_ = fVar2;
          auVar28._12_4_ = fVar2;
          auVar28._16_4_ = fVar2;
          auVar28._20_4_ = fVar2;
          auVar28._24_4_ = fVar2;
          auVar28._28_4_ = fVar2;
          auVar19._4_4_ = fVar2 * auVar14._4_4_;
          auVar19._0_4_ = fVar2 * auVar14._0_4_;
          auVar19._8_4_ = fVar2 * auVar14._8_4_;
          auVar19._12_4_ = fVar2 * auVar14._12_4_;
          auVar19._16_4_ = fVar2 * auVar14._16_4_;
          auVar19._20_4_ = fVar2 * auVar14._20_4_;
          auVar19._24_4_ = fVar2 * auVar14._24_4_;
          auVar19._28_4_ = auVar14._28_4_;
          auVar31._4_4_ = fStack_123c;
          auVar31._0_4_ = local_1240;
          auVar31._8_4_ = fStack_1238;
          auVar31._12_4_ = fStack_1234;
          auVar31._16_4_ = fStack_1230;
          auVar31._20_4_ = fStack_122c;
          auVar31._24_4_ = fStack_1228;
          auVar31._28_4_ = fStack_1224;
          auVar57 = vfmsub231ps_fma(auVar19,auVar13,auVar31);
          auVar20._4_4_ = auVar12._4_4_ * auVar57._4_4_;
          auVar20._0_4_ = auVar12._0_4_ * auVar57._0_4_;
          auVar20._8_4_ = auVar12._8_4_ * auVar57._8_4_;
          auVar20._12_4_ = auVar12._12_4_ * auVar57._12_4_;
          auVar20._16_4_ = auVar12._16_4_ * 0.0;
          auVar20._20_4_ = auVar12._20_4_ * 0.0;
          auVar20._24_4_ = auVar12._24_4_ * 0.0;
          auVar20._28_4_ = auVar12._28_4_;
          auVar12._4_4_ = auVar10._4_4_ * auVar57._4_4_;
          auVar12._0_4_ = auVar10._0_4_ * auVar57._0_4_;
          auVar12._8_4_ = auVar10._8_4_ * auVar57._8_4_;
          auVar12._12_4_ = auVar10._12_4_ * auVar57._12_4_;
          auVar12._16_4_ = auVar10._16_4_ * 0.0;
          auVar12._20_4_ = auVar10._20_4_ * 0.0;
          auVar12._24_4_ = auVar10._24_4_ * 0.0;
          auVar12._28_4_ = auVar10._28_4_;
          auVar30._4_4_ = fStack_125c;
          auVar30._0_4_ = local_1260;
          auVar30._8_4_ = fStack_1258;
          auVar30._12_4_ = fStack_1254;
          auVar30._16_4_ = fStack_1250;
          auVar30._20_4_ = fStack_124c;
          auVar30._24_4_ = fStack_1248;
          auVar30._28_4_ = fStack_1244;
          auVar10._4_4_ = fStack_125c * auVar13._4_4_;
          auVar10._0_4_ = local_1260 * auVar13._0_4_;
          auVar10._8_4_ = fStack_1258 * auVar13._8_4_;
          auVar10._12_4_ = fStack_1254 * auVar13._12_4_;
          auVar10._16_4_ = fStack_1250 * auVar13._16_4_;
          auVar10._20_4_ = fStack_124c * auVar13._20_4_;
          auVar10._24_4_ = fStack_1248 * auVar13._24_4_;
          auVar10._28_4_ = auVar13._28_4_;
          auVar62 = vfmsub231ps_fma(auVar10,auVar15,auVar28);
          auVar57 = vfmadd231ps_fma(auVar20,ZEXT1632(auVar62),auVar11);
          local_13a0 = auVar74._0_4_;
          fStack_139c = auVar74._4_4_;
          fStack_1398 = auVar74._8_4_;
          fStack_1394 = auVar74._12_4_;
          fStack_1390 = auVar74._16_4_;
          fStack_138c = auVar74._20_4_;
          fStack_1388 = auVar74._24_4_;
          auVar21._4_4_ = auVar11._4_4_ * fStack_139c;
          auVar21._0_4_ = auVar11._0_4_ * local_13a0;
          auVar21._8_4_ = auVar11._8_4_ * fStack_1398;
          auVar21._12_4_ = auVar11._12_4_ * fStack_1394;
          auVar21._16_4_ = auVar11._16_4_ * fStack_1390;
          auVar21._20_4_ = auVar11._20_4_ * fStack_138c;
          auVar21._24_4_ = auVar11._24_4_ * fStack_1388;
          auVar21._28_4_ = auVar11._28_4_;
          auVar17 = vfmsub231ps_fma(auVar21,local_11c0,auVar87);
          auVar62 = vfmadd231ps_fma(auVar12,auVar87,ZEXT1632(auVar62));
          auVar11._4_4_ = fStack_123c * auVar15._4_4_;
          auVar11._0_4_ = local_1240 * auVar15._0_4_;
          auVar11._8_4_ = fStack_1238 * auVar15._8_4_;
          auVar11._12_4_ = fStack_1234 * auVar15._12_4_;
          auVar11._16_4_ = fStack_1230 * auVar15._16_4_;
          auVar11._20_4_ = fStack_122c * auVar15._20_4_;
          auVar11._24_4_ = fStack_1228 * auVar15._24_4_;
          auVar11._28_4_ = auVar15._28_4_;
          auVar18 = vfmsub231ps_fma(auVar11,auVar30,auVar14);
          fVar3 = auVar17._0_4_;
          fVar4 = auVar17._4_4_;
          auVar22._4_4_ = fStack_125c * fVar4;
          auVar22._0_4_ = local_1260 * fVar3;
          fVar8 = auVar17._8_4_;
          auVar22._8_4_ = fStack_1258 * fVar8;
          fVar9 = auVar17._12_4_;
          auVar22._12_4_ = fStack_1254 * fVar9;
          auVar22._16_4_ = fStack_1250 * 0.0;
          auVar22._20_4_ = fStack_124c * 0.0;
          auVar22._24_4_ = fStack_1248 * 0.0;
          auVar22._28_4_ = fStack_1244;
          auVar73 = vfmadd231ps_fma(auVar22,auVar31,ZEXT1632(auVar81));
          auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),ZEXT1632(auVar18),local_11c0);
          auVar76._8_4_ = 0x80000000;
          auVar76._0_8_ = 0x8000000080000000;
          auVar76._12_4_ = 0x80000000;
          auVar76._16_4_ = 0x80000000;
          auVar76._20_4_ = 0x80000000;
          auVar76._24_4_ = 0x80000000;
          auVar76._28_4_ = 0x80000000;
          auVar29._4_4_ = fVar2;
          auVar29._0_4_ = fVar2;
          auVar29._8_4_ = fVar2;
          auVar29._12_4_ = fVar2;
          auVar29._16_4_ = fVar2;
          auVar29._20_4_ = fVar2;
          auVar29._24_4_ = fVar2;
          auVar29._28_4_ = fVar2;
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar29,ZEXT1632(auVar16));
          auVar87 = vandps_avx(ZEXT1632(auVar73),auVar76);
          uVar37 = auVar87._0_4_;
          auVar84._0_4_ = (float)(uVar37 ^ auVar57._0_4_);
          uVar38 = auVar87._4_4_;
          auVar84._4_4_ = (float)(uVar38 ^ auVar57._4_4_);
          uVar39 = auVar87._8_4_;
          auVar84._8_4_ = (float)(uVar39 ^ auVar57._8_4_);
          uVar77 = auVar87._12_4_;
          auVar84._12_4_ = (float)(uVar77 ^ auVar57._12_4_);
          local_1140._16_4_ = auVar87._16_4_;
          auVar84._16_4_ = local_1140._16_4_;
          local_1140._20_4_ = auVar87._20_4_;
          auVar84._20_4_ = local_1140._20_4_;
          local_1140._24_4_ = auVar87._24_4_;
          auVar84._24_4_ = local_1140._24_4_;
          local_1140._28_4_ = auVar87._28_4_;
          auVar84._28_4_ = local_1140._28_4_;
          auVar57 = vfmadd231ps_fma(ZEXT1632(auVar62),ZEXT1632(auVar18),auVar74);
          local_1160._0_4_ = (float)(uVar37 ^ auVar57._0_4_);
          local_1160._4_4_ = (float)(uVar38 ^ auVar57._4_4_);
          local_1160._8_4_ = (float)(uVar39 ^ auVar57._8_4_);
          local_1160._12_4_ = (float)(uVar77 ^ auVar57._12_4_);
          local_1160._16_4_ = local_1140._16_4_;
          local_1160._20_4_ = local_1140._20_4_;
          local_1160._24_4_ = local_1140._24_4_;
          local_1160._28_4_ = local_1140._28_4_;
          auVar87 = vcmpps_avx(auVar84,ZEXT832(0) << 0x20,5);
          auVar74 = vcmpps_avx(local_1160,ZEXT832(0) << 0x20,5);
          auVar87 = vandps_avx(auVar74,auVar87);
          auVar68._8_4_ = 0x7fffffff;
          auVar68._0_8_ = 0x7fffffff7fffffff;
          auVar68._12_4_ = 0x7fffffff;
          auVar68._16_4_ = 0x7fffffff;
          auVar68._20_4_ = 0x7fffffff;
          auVar68._24_4_ = 0x7fffffff;
          auVar68._28_4_ = 0x7fffffff;
          local_1120 = vandps_avx(ZEXT1632(auVar73),auVar68);
          auVar74 = vcmpps_avx(ZEXT1632(auVar73),ZEXT832(0) << 0x20,4);
          auVar87 = vandps_avx(auVar74,auVar87);
          auVar59._0_4_ = auVar84._0_4_ + local_1160._0_4_;
          auVar59._4_4_ = auVar84._4_4_ + local_1160._4_4_;
          auVar59._8_4_ = auVar84._8_4_ + local_1160._8_4_;
          auVar59._12_4_ = auVar84._12_4_ + local_1160._12_4_;
          auVar59._16_4_ = local_1140._16_4_ + local_1140._16_4_;
          auVar59._20_4_ = local_1140._20_4_ + local_1140._20_4_;
          auVar59._24_4_ = local_1140._24_4_ + local_1140._24_4_;
          auVar59._28_4_ = local_1140._28_4_ + local_1140._28_4_;
          auVar74 = vcmpps_avx(auVar59,local_1120,2);
          auVar10 = auVar74 & auVar87;
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0x7f,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0xbf,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar10[0x1f] < '\0') {
            auVar87 = vandps_avx(auVar87,auVar74);
            auVar57 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
            auVar69._0_4_ = auVar15._0_4_ * fVar3;
            auVar69._4_4_ = auVar15._4_4_ * fVar4;
            auVar69._8_4_ = auVar15._8_4_ * fVar8;
            auVar69._12_4_ = auVar15._12_4_ * fVar9;
            auVar69._16_4_ = auVar15._16_4_ * 0.0;
            auVar69._20_4_ = auVar15._20_4_ * 0.0;
            auVar69._24_4_ = auVar15._24_4_ * 0.0;
            auVar69._28_4_ = 0;
            auVar62 = vfmadd132ps_fma(auVar14,auVar69,ZEXT1632(auVar81));
            auVar62 = vfmadd132ps_fma(auVar13,ZEXT1632(auVar62),ZEXT1632(auVar16));
            local_1140._0_4_ = (float)(uVar37 ^ auVar62._0_4_);
            local_1140._4_4_ = (float)(uVar38 ^ auVar62._4_4_);
            local_1140._8_4_ = (float)(uVar39 ^ auVar62._8_4_);
            local_1140._12_4_ = (float)(uVar77 ^ auVar62._12_4_);
            fVar72 = *(float *)(ray + k * 4 + 0x30);
            auVar23._4_4_ = local_1120._4_4_ * fVar72;
            auVar23._0_4_ = local_1120._0_4_ * fVar72;
            auVar23._8_4_ = local_1120._8_4_ * fVar72;
            auVar23._12_4_ = local_1120._12_4_ * fVar72;
            auVar23._16_4_ = local_1120._16_4_ * fVar72;
            auVar23._20_4_ = local_1120._20_4_ * fVar72;
            auVar23._24_4_ = local_1120._24_4_ * fVar72;
            auVar23._28_4_ = fVar72;
            auVar87 = vcmpps_avx(auVar23,local_1140,1);
            fVar72 = *(float *)(ray + k * 4 + 0x80);
            auVar24._4_4_ = local_1120._4_4_ * fVar72;
            auVar24._0_4_ = local_1120._0_4_ * fVar72;
            auVar24._8_4_ = local_1120._8_4_ * fVar72;
            auVar24._12_4_ = local_1120._12_4_ * fVar72;
            auVar24._16_4_ = local_1120._16_4_ * fVar72;
            auVar24._20_4_ = local_1120._20_4_ * fVar72;
            auVar24._24_4_ = local_1120._24_4_ * fVar72;
            auVar24._28_4_ = fVar72;
            auVar74 = vcmpps_avx(local_1140,auVar24,2);
            auVar87 = vandps_avx(auVar87,auVar74);
            auVar62 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
            auVar57 = vpand_avx(auVar62,auVar57);
            auVar87 = vpmovzxwd_avx2(auVar57);
            auVar87 = vpslld_avx2(auVar87,0x1f);
            if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar87 >> 0x7f,0) != '\0') ||
                  (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar87 >> 0xbf,0) != '\0') ||
                (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar87[0x1f] < '\0') {
              local_10a0 = vpsrad_avx2(auVar87,0x1f);
              local_1180 = auVar84;
              local_13e0 = auVar16._0_8_;
              uStack_13d8 = auVar16._8_8_;
              uVar34 = uStack_13d8;
              local_1100 = local_13e0;
              uStack_10f8 = uStack_13d8;
              uStack_10f0 = 0;
              uStack_10e8 = 0;
              local_13c0 = auVar81._0_8_;
              uStack_13b8 = auVar81._8_8_;
              local_10e0 = local_13c0;
              uStack_10d8 = uStack_13b8;
              uStack_10d0 = 0;
              uStack_10c8 = 0;
              local_1380 = auVar17._0_8_;
              uStack_1378 = auVar17._8_8_;
              local_10c0 = local_1380;
              uStack_10b8 = uStack_1378;
              uStack_10b0 = 0;
              uStack_10a8 = 0;
              local_fc0 = local_1280;
              local_12c0 = local_10a0;
              auVar74 = vrcpps_avx(local_1120);
              auVar70._8_4_ = 0x3f800000;
              auVar70._0_8_ = 0x3f8000003f800000;
              auVar70._12_4_ = 0x3f800000;
              auVar70._16_4_ = 0x3f800000;
              auVar70._20_4_ = 0x3f800000;
              auVar70._24_4_ = 0x3f800000;
              auVar70._28_4_ = 0x3f800000;
              auVar62 = vfnmadd213ps_fma(local_1120,auVar74,auVar70);
              auVar62 = vfmadd132ps_fma(ZEXT1632(auVar62),auVar74,auVar74);
              fVar61 = auVar62._0_4_;
              auVar63._0_4_ = fVar61 * local_1140._0_4_;
              fVar65 = auVar62._4_4_;
              auVar63._4_4_ = fVar65 * local_1140._4_4_;
              fVar66 = auVar62._8_4_;
              fVar72 = auVar62._12_4_;
              auVar63._8_4_ = fVar66 * local_1140._8_4_;
              auVar63._12_4_ = fVar72 * local_1140._12_4_;
              auVar63._16_4_ = local_1140._16_4_ * 0.0;
              auVar63._20_4_ = local_1140._20_4_ * 0.0;
              auVar63._24_4_ = local_1140._24_4_ * 0.0;
              auVar63._28_4_ = 0;
              local_1040 = auVar63;
              auVar25._4_4_ = fVar65 * auVar84._4_4_;
              auVar25._0_4_ = fVar61 * auVar84._0_4_;
              auVar25._8_4_ = fVar66 * auVar84._8_4_;
              auVar25._12_4_ = fVar72 * auVar84._12_4_;
              auVar25._16_4_ = local_1140._16_4_ * 0.0;
              auVar25._20_4_ = local_1140._20_4_ * 0.0;
              auVar25._24_4_ = local_1140._24_4_ * 0.0;
              auVar25._28_4_ = auVar74._28_4_;
              auVar85._8_4_ = 0x3f800000;
              auVar85._0_8_ = 0x3f8000003f800000;
              auVar85._12_4_ = 0x3f800000;
              auVar85._16_4_ = 0x3f800000;
              auVar85._20_4_ = 0x3f800000;
              auVar85._24_4_ = 0x3f800000;
              auVar85._28_4_ = 0x3f800000;
              auVar74 = vminps_avx(auVar25,auVar85);
              auVar26._4_4_ = fVar65 * local_1160._4_4_;
              auVar26._0_4_ = fVar61 * local_1160._0_4_;
              auVar26._8_4_ = fVar66 * local_1160._8_4_;
              auVar26._12_4_ = fVar72 * local_1160._12_4_;
              auVar26._16_4_ = local_1140._16_4_ * 0.0;
              auVar26._20_4_ = local_1140._20_4_ * 0.0;
              auVar26._24_4_ = local_1140._24_4_ * 0.0;
              auVar26._28_4_ = 0;
              auVar10 = vminps_avx(auVar26,auVar85);
              auVar11 = vsubps_avx(auVar85,auVar74);
              auVar12 = vsubps_avx(auVar85,auVar10);
              local_1060 = vblendvps_avx(auVar10,auVar11,local_1280);
              local_1080 = vblendvps_avx(auVar74,auVar12,local_1280);
              local_13e0._0_4_ = auVar16._0_4_;
              local_13e0._4_4_ = auVar16._4_4_;
              uStack_13d8._0_4_ = auVar16._8_4_;
              uStack_13d8._4_4_ = auVar16._12_4_;
              fVar72 = local_12a0._0_4_;
              fVar61 = local_12a0._4_4_;
              fVar65 = local_12a0._8_4_;
              fVar66 = local_12a0._12_4_;
              fVar78 = local_12a0._16_4_;
              fVar79 = local_12a0._20_4_;
              fVar80 = local_12a0._24_4_;
              local_13c0._0_4_ = auVar81._0_4_;
              local_13c0._4_4_ = auVar81._4_4_;
              uStack_13b8._0_4_ = auVar81._8_4_;
              uStack_13b8._4_4_ = auVar81._12_4_;
              local_fe0._4_4_ = fVar61 * fVar4;
              local_fe0._0_4_ = fVar72 * fVar3;
              local_fe0._8_4_ = fVar65 * fVar8;
              local_fe0._12_4_ = fVar66 * fVar9;
              local_fe0._16_4_ = fVar78 * 0.0;
              local_fe0._20_4_ = fVar79 * 0.0;
              local_fe0._24_4_ = fVar80 * 0.0;
              local_fe0._28_4_ = 0;
              local_1020[0] = fVar72 * (float)local_13e0._0_4_;
              local_1020[1] = fVar61 * (float)local_13e0._4_4_;
              local_1020[2] = fVar65 * (float)uStack_13d8;
              local_1020[3] = fVar66 * uStack_13d8._4_4_;
              fStack_1010 = fVar78 * 0.0;
              fStack_100c = fVar79 * 0.0;
              fStack_1008 = fVar80 * 0.0;
              uStack_1004 = local_1080._28_4_;
              local_1000[0] = fVar72 * (float)local_13c0._0_4_;
              local_1000[1] = fVar61 * (float)local_13c0._4_4_;
              local_1000[2] = fVar65 * (float)uStack_13b8;
              local_1000[3] = fVar66 * uStack_13b8._4_4_;
              fStack_ff0 = fVar78 * 0.0;
              fStack_fec = fVar79 * 0.0;
              fStack_fe8 = fVar80 * 0.0;
              uStack_fe4 = local_1060._28_4_;
              auVar60._8_4_ = 0x7f800000;
              auVar60._0_8_ = 0x7f8000007f800000;
              auVar60._12_4_ = 0x7f800000;
              auVar60._16_4_ = 0x7f800000;
              auVar60._20_4_ = 0x7f800000;
              auVar60._24_4_ = 0x7f800000;
              auVar60._28_4_ = 0x7f800000;
              auVar87 = vblendvps_avx(auVar60,auVar63,auVar87);
              auVar74 = vshufps_avx(auVar87,auVar87,0xb1);
              auVar74 = vminps_avx(auVar87,auVar74);
              auVar10 = vshufpd_avx(auVar74,auVar74,5);
              auVar74 = vminps_avx(auVar74,auVar10);
              auVar10 = vpermpd_avx2(auVar74,0x4e);
              auVar74 = vminps_avx(auVar74,auVar10);
              auVar87 = vcmpps_avx(auVar74,auVar87,0);
              auVar62 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
              auVar57 = vpand_avx(auVar57,auVar62);
              auVar87 = vpmovzxwd_avx2(auVar57);
              auVar87 = vpslld_avx2(auVar87,0x1f);
              if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar87 >> 0x7f,0) == '\0') &&
                    (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar87 >> 0xbf,0) == '\0') &&
                  (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar87[0x1f]) {
                auVar87 = local_10a0;
              }
              uVar38 = vmovmskps_avx(auVar87);
              uVar37 = 0;
              for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x80000000) {
                uVar37 = uVar37 + 1;
              }
              uVar43 = (ulong)uVar37;
              pRVar7 = (context->scene->geometries).items;
              uVar37 = *(uint *)(ray + k * 4 + 0x90);
              uVar40 = (ulong)*(uint *)((long)&local_12e0 + uVar43 * 4);
              _local_13e0 = ZEXT1632(CONCAT88(uVar34,uVar40));
              while (((pRVar7[uVar40].ptr)->mask & uVar37) == 0) {
                *(undefined4 *)(local_12c0 + uVar43 * 4) = 0;
                if ((((((((local_12c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_12c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_12c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_12c0 >> 0x7f,0) == '\0') &&
                      (local_12c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_12c0 >> 0xbf,0) == '\0') &&
                    (local_12c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_12c0[0x1f]) goto LAB_0050d2d5;
                auVar64._8_4_ = 0x7f800000;
                auVar64._0_8_ = 0x7f8000007f800000;
                auVar64._12_4_ = 0x7f800000;
                auVar64._16_4_ = 0x7f800000;
                auVar64._20_4_ = 0x7f800000;
                auVar64._24_4_ = 0x7f800000;
                auVar64._28_4_ = 0x7f800000;
                auVar87 = vblendvps_avx(auVar64,auVar63,local_12c0);
                auVar74 = vshufps_avx(auVar87,auVar87,0xb1);
                auVar74 = vminps_avx(auVar87,auVar74);
                auVar10 = vshufpd_avx(auVar74,auVar74,5);
                auVar74 = vminps_avx(auVar74,auVar10);
                auVar10 = vpermpd_avx2(auVar74,0x4e);
                auVar74 = vminps_avx(auVar74,auVar10);
                auVar74 = vcmpps_avx(auVar87,auVar74,0);
                auVar10 = local_12c0 & auVar74;
                auVar87 = local_12c0;
                if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar10 >> 0x7f,0) != '\0') ||
                      (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar10 >> 0xbf,0) != '\0') ||
                    (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar10[0x1f] < '\0') {
                  auVar87 = vandps_avx(auVar74,local_12c0);
                }
                uVar39 = vmovmskps_avx(auVar87);
                uVar38 = 0;
                for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x80000000) {
                  uVar38 = uVar38 + 1;
                }
                uVar43 = (ulong)uVar38;
                uVar40 = CONCAT44(0,*(uint *)((long)&local_12e0 + uVar43 * 4));
                local_13e0 = (undefined1  [8])uVar40;
              }
              uVar40 = (ulong)(uint)((int)uVar43 << 2);
              uVar6 = *(undefined4 *)(local_1080 + uVar40);
              uVar5 = *(undefined4 *)(local_1060 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1040 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_1020 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_1000 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_fe0 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar6;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_11a0 + uVar40);
              *(int *)(ray + k * 4 + 0x120) = local_13e0._0_4_;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
          }
LAB_0050d2d5:
          lVar48 = lVar48 + 1;
        } while (lVar48 != uVar47 - 8);
      }
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar71 = ZEXT1664(CONCAT412(uVar6,CONCAT48(uVar6,CONCAT44(uVar6,uVar6))));
    }
    if (pauVar46 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }